

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test::
~SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test
          (SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test
            ((SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows3_Test *)0x1e92d8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableAssignmentTypeMismatchThrows3)
{
  std::string source = R"SRC(
  fn f(): function
  {
    ret \(x: f32): void = { };
  }
  
  fn main(): f32
  {
    let x: f32 = 12;
    x = f();
    ret 0;
  }
  )SRC";
  throwTest(source);
}